

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Layer::update
          (Layer *this,int frameNumber,VMatrix *parentMatrix,float parentAlpha)

{
  VMatrix *this_00;
  Layer *this_01;
  LayerMask *this_02;
  bool bVar1;
  float fVar2;
  float parentAlpha_00;
  VMatrix m;
  VMatrix local_40;
  
  this->mFrameNo = frameNumber;
  this_01 = this->mLayerData;
  if ((this_01->mInFrame <= frameNumber) && (frameNumber <= this_01->mOutFrame)) {
    fVar2 = model::Layer::opacity(this_01,frameNumber);
    fVar2 = fVar2 * parentAlpha;
    if (ABS(fVar2) <= 1e-06) {
      this->mCombinedAlpha = 0.0;
    }
    else {
      matrix(&local_40,this,this->mFrameNo);
      VMatrix::operator*=(&local_40,parentMatrix);
      this_00 = &this->mCombinedMatrix;
      bVar1 = VMatrix::operator!=(this_00,&local_40);
      if (bVar1) {
        *(byte *)&(this->mDirtyFlag).i = (byte)(this->mDirtyFlag).i | 1;
        *(ulong *)((long)&(this->mCombinedMatrix).mty + 2) =
             CONCAT62(local_40._32_6_,local_40.mty._2_2_);
        (this->mCombinedMatrix).m22 = local_40.m22;
        (this->mCombinedMatrix).m23 = local_40.m23;
        (this->mCombinedMatrix).mtx = (float)local_40.mtx;
        (this->mCombinedMatrix).mty =
             (float)(int)(CONCAT26(local_40.mty._2_2_,local_40._24_6_) >> 0x20);
        this_00->m11 = local_40.m11;
        this_00->m12 = local_40.m12;
        (this->mCombinedMatrix).m13 = local_40.m13;
        (this->mCombinedMatrix).m21 = local_40.m21;
      }
      parentAlpha_00 = ABS(this->mCombinedAlpha - fVar2);
      if (1e-06 <= parentAlpha_00) {
        *(byte *)&(this->mDirtyFlag).i = (byte)(this->mDirtyFlag).i | 2;
        this->mCombinedAlpha = fVar2;
      }
      this_02 = (this->mLayerMask)._M_t.
                super___uniq_ptr_impl<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                ._M_t.
                super__Tuple_impl<0UL,_rlottie::internal::renderer::LayerMask_*,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                .super__Head_base<0UL,_rlottie::internal::renderer::LayerMask_*,_false>._M_head_impl
      ;
      if (this_02 != (LayerMask *)0x0) {
        LayerMask::update(this_02,this->mFrameNo,this_00,parentAlpha_00,&this->mDirtyFlag);
      }
      if (((this->mLayerData->mLayerType == Precomp) || ((this->mDirtyFlag).i != 0)) ||
         ((undefined1  [16])
          ((undefined1  [16])(this->mLayerData->super_Group).super_Object.field_0 &
          (undefined1  [16])0x100000000000000) == (undefined1  [16])0x0)) {
        (*this->_vptr_Layer[8])(this);
        (this->mDirtyFlag).i = 0;
      }
    }
  }
  return;
}

Assistant:

void renderer::Layer::update(int frameNumber, const VMatrix &parentMatrix,
                             float parentAlpha)
{
    mFrameNo = frameNumber;
    // 1. check if the layer is part of the current frame
    if (!visible()) return;

    float alpha = parentAlpha * opacity(frameNo());
    if (vIsZero(alpha)) {
        mCombinedAlpha = 0;
        return;
    }

    // 2. calculate the parent matrix and alpha
    VMatrix m = matrix(frameNo());
    m *= parentMatrix;

    // 3. update the dirty flag based on the change
    if (mCombinedMatrix != m) {
        mDirtyFlag |= DirtyFlagBit::Matrix;
        mCombinedMatrix = m;
    }

    if (!vCompare(mCombinedAlpha, alpha)) {
        mDirtyFlag |= DirtyFlagBit::Alpha;
        mCombinedAlpha = alpha;
    }

    // 4. update the mask
    if (mLayerMask) {
        mLayerMask->update(frameNo(), mCombinedMatrix, mCombinedAlpha,
                           mDirtyFlag);
    }

    // 5. if no parent property change and layer is static then nothing to do.
    if (!mLayerData->precompLayer() && flag().testFlag(DirtyFlagBit::None) &&
        isStatic())
        return;

    // 6. update the content of the layer
    updateContent();

    // 7. reset the dirty flag
    mDirtyFlag = DirtyFlagBit::None;
}